

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void Catch::cleanupSingletons(void)

{
  pointer ppIVar1;
  vector<Catch::ISingleton_*,_std::allocator<Catch::ISingleton_*>_> *pvVar2;
  pointer ppIVar3;
  
  anon_unknown_1::getSingletons();
  ppIVar1 = (anon_unknown_1::getSingletons::g_singletons->
            super__Vector_base<Catch::ISingleton_*,_std::allocator<Catch::ISingleton_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppIVar3 = (anon_unknown_1::getSingletons::g_singletons->
                 super__Vector_base<Catch::ISingleton_*,_std::allocator<Catch::ISingleton_*>_>).
                 _M_impl.super__Vector_impl_data._M_start;
      pvVar2 = anon_unknown_1::getSingletons::g_singletons, ppIVar3 != ppIVar1;
      ppIVar3 = ppIVar3 + 1) {
    if (*ppIVar3 != (ISingleton *)0x0) {
      (*(*ppIVar3)->_vptr_ISingleton[1])();
    }
  }
  if (anon_unknown_1::getSingletons::g_singletons !=
      (vector<Catch::ISingleton_*,_std::allocator<Catch::ISingleton_*>_> *)0x0) {
    clara::std::_Vector_base<Catch::ISingleton_*,_std::allocator<Catch::ISingleton_*>_>::
    ~_Vector_base(&anon_unknown_1::getSingletons::g_singletons->
                   super__Vector_base<Catch::ISingleton_*,_std::allocator<Catch::ISingleton_*>_>);
  }
  operator_delete(pvVar2);
  anon_unknown_1::getSingletons::g_singletons =
       (vector<Catch::ISingleton_*,_std::allocator<Catch::ISingleton_*>_> *)0x0;
  return;
}

Assistant:

void cleanupSingletons() {
        auto& singletons = getSingletons();
        for( auto singleton : *singletons )
            delete singleton;
        delete singletons;
        singletons = nullptr;
    }